

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_loader.cpp
# Opt level: O0

void __thiscall embree::SceneGraph::PlyParser::readBytes(PlyParser *this,void *dst,int num)

{
  runtime_error *this_00;
  int in_EDX;
  long in_RSI;
  char *in_RDI;
  int i;
  int local_18;
  
  if (*(int *)(in_RDI + 0x260) == 2) {
    std::istream::read(in_RDI,in_RSI);
  }
  else {
    if (*(int *)(in_RDI + 0x260) != 1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"internal error on PLY loader");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    for (local_18 = 0; local_18 < in_EDX; local_18 = local_18 + 1) {
      std::istream::read(in_RDI,((in_RSI + in_EDX) - (long)local_18) + -1);
    }
  }
  return;
}

Assistant:

void readBytes(void* dst, int num) {
        if (format == BINARY_LITTLE_ENDIAN) fs.read((char*)dst,num);
        else if (format == BINARY_BIG_ENDIAN) for (int i=0; i<num; i++) fs.read((char*)dst+num-i-1,1);
        else throw std::runtime_error("internal error on PLY loader");
      }